

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integer.cpp
# Opt level: O2

clock_t Integer::times(tms *__buffer)

{
  long lVar1;
  long lVar2;
  Integer *this;
  long lVar3;
  int i;
  ulong uVar4;
  long local_38;
  
  this = (Integer *)operator_new(0x18);
  local_38 = 1;
  Integer(this,&local_38);
  lVar1 = __buffer->tms_utime;
  lVar2 = __buffer->tms_stime;
  for (uVar4 = 0; uVar4 < (ulong)(lVar2 - lVar1 >> 3); uVar4 = uVar4 + 1) {
    lVar3 = __dynamic_cast(*(undefined8 *)(lVar1 + uVar4 * 8),&Data::typeinfo,&typeinfo,0);
    this->value = this->value * *(long *)(lVar3 + 0x10);
  }
  return (clock_t)this;
}

Assistant:

Data *Integer::times(std::vector<Data *> *dataPara) {
    auto result = new Integer(1);
    for (int i = 0; i < dataPara->size(); i++) {
        result->value *= (dynamic_cast<Integer *>((*dataPara)[i]))->value;
    }
    return result;
}